

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O2

size_t onmt::unicode::utf8len(string *str)

{
  code_point_t cVar1;
  size_t sVar2;
  size_t sVar3;
  pointer str_00;
  size_t char_size;
  
  sVar3 = 0;
  for (str_00 = (str->_M_dataplus)._M_p; *str_00 != '\0'; str_00 = str_00 + sVar2) {
    char_size = 0;
    cVar1 = utf8_to_cp(str_00,&char_size);
    sVar2 = 1;
    if (cVar1 != 0) {
      sVar2 = char_size;
    }
    sVar3 = sVar3 + (cVar1 != 0);
  }
  return sVar3;
}

Assistant:

bool is_mark(code_point_t u)
    {
      return get_char_type(u) == CharType::Mark;
    }